

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderLibraryCase.cpp
# Opt level: O1

void deqp::sl::genCompareFunctions(ostringstream *stream,ValueBlock *valueBlock,bool useFloatTypes)

{
  Value *val;
  pointer pVVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  char *pcVar5;
  bool cmpTypeFound [94];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 uStack_28;
  undefined6 uStack_20;
  undefined2 local_1a;
  undefined6 uStack_18;
  undefined8 uStack_12;
  
  uStack_18 = 0;
  uStack_12 = 0;
  uStack_28 = 0;
  uStack_20 = 0;
  local_1a = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  pVVar1 = (valueBlock->values).
           super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = (int)((long)(valueBlock->values).
                      super__Vector_base<deqp::sl::ShaderCase::Value,_std::allocator<deqp::sl::ShaderCase::Value>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1 >> 3) * 0x38e38e39;
  if (0 < (int)uVar2) {
    uVar3 = (ulong)(uVar2 & 0x7fffffff);
    do {
      if (pVVar1->storageType == STORAGE_OUTPUT) {
        *(undefined1 *)((long)&local_68 + (long)(int)pVVar1->dataType) = 1;
      }
      pVVar1 = pVVar1 + 1;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  if (useFloatTypes) {
    if (local_48._3_1_ != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (float a, bool b) { return ((a > 0.5) == b); }\n",0x39);
    }
    if (local_48._4_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (vec2 a, bvec2 b) { return (greaterThan(a, vec2(0.5)) == b); }\n",0x49);
    }
    if (local_48._5_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (vec3 a, bvec3 b) { return (greaterThan(a, vec3(0.5)) == b); }\n",0x49);
    }
    if (local_48._6_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (vec4 a, bvec4 b) { return (greaterThan(a, vec4(0.5)) == b); }\n",0x49);
    }
    if (uStack_50._3_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (float a, int b)  { float atemp = a+0.5; return (float(b) <= atemp && atemp <= float(b+1)); }\n"
                 ,0x68);
    }
    if (uStack_50._4_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (vec2 a, ivec2 b) { return (ivec2(floor(a + 0.5)) == b); }\n",0x45);
    }
    if (uStack_50._5_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (vec3 a, ivec3 b) { return (ivec3(floor(a + 0.5)) == b); }\n",0x45);
    }
    if (uStack_50._6_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (vec4 a, ivec4 b) { return (ivec4(floor(a + 0.5)) == b); }\n",0x45);
    }
    if (uStack_50._7_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (float a, uint b) { float atemp = a+0.5; return (float(b) <= atemp && atemp <= float(b+1)); }\n"
                 ,0x68);
    }
    if ((char)local_48 == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (vec2 a, uvec2 b) { return (uvec2(floor(a + 0.5)) == b); }\n",0x45);
    }
    if (local_48._1_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (vec3 a, uvec3 b) { return (uvec3(floor(a + 0.5)) == b); }\n",0x45);
    }
    if (local_48._2_1_ != '\x01') goto LAB_00db01f0;
    pcVar5 = "bool isOk (vec4 a, uvec4 b) { return (uvec4(floor(a + 0.5)) == b); }\n";
    lVar4 = 0x45;
  }
  else {
    if (local_48._3_1_ != '\0') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (bool a, bool b)   { return (a == b); }\n",0x32);
    }
    if (local_48._4_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (bvec2 a, bvec2 b) { return (a == b); }\n",0x32);
    }
    if (local_48._5_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (bvec3 a, bvec3 b) { return (a == b); }\n",0x32);
    }
    if (local_48._6_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (bvec4 a, bvec4 b) { return (a == b); }\n",0x32);
    }
    if (uStack_50._3_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (int a, int b)     { return (a == b); }\n",0x32);
    }
    if (uStack_50._4_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (ivec2 a, ivec2 b) { return (a == b); }\n",0x32);
    }
    if (uStack_50._5_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (ivec3 a, ivec3 b) { return (a == b); }\n",0x32);
    }
    if (uStack_50._6_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (ivec4 a, ivec4 b) { return (a == b); }\n",0x32);
    }
    if (uStack_50._7_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (uint a, uint b)   { return (a == b); }\n",0x32);
    }
    if ((char)local_48 == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (uvec2 a, uvec2 b) { return (a == b); }\n",0x32);
    }
    if (local_48._1_1_ == '\x01') {
      std::__ostream_insert<char,std::char_traits<char>>
                (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
                 "bool isOk (uvec3 a, uvec3 b) { return (a == b); }\n",0x32);
    }
    if (local_48._2_1_ != '\x01') goto LAB_00db01f0;
    pcVar5 = "bool isOk (uvec4 a, uvec4 b) { return (a == b); }\n";
    lVar4 = 0x32;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (&stream->super_basic_ostream<char,_std::char_traits<char>_>,pcVar5,lVar4);
LAB_00db01f0:
  if (local_68._1_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (float a, float b, float eps) { return (abs(a-b) <= (eps*abs(b) + eps)); }\n"
               ,0x55);
  }
  if (local_68._2_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (vec2 a, vec2 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n"
               ,99);
  }
  if (local_68._3_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (vec3 a, vec3 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n"
               ,99);
  }
  if (local_68._4_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (vec4 a, vec4 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n"
               ,99);
  }
  if (local_68._5_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (mat2 a, mat2 b, float eps) { vec2 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return all(lessThanEqual(diff, vec2(eps))); }\n"
               ,0x87);
  }
  if (local_68._6_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (mat2x3 a, mat2x3 b, float eps) { vec3 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return all(lessThanEqual(diff, vec3(eps))); }\n"
               ,0x8b);
  }
  if (local_68._7_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (mat2x4 a, mat2x4 b, float eps) { vec4 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return all(lessThanEqual(diff, vec4(eps))); }\n"
               ,0x8b);
  }
  if ((char)uStack_60 == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (mat3x2 a, mat3x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), abs(a[2]-b[2])); return all(lessThanEqual(diff, vec2(eps))); }\n"
               ,0xa0);
  }
  if (uStack_60._1_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (mat3 a, mat3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), abs(a[2]-b[2])); return all(lessThanEqual(diff, vec3(eps))); }\n"
               ,0x9c);
  }
  if (uStack_60._2_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (mat3x4 a, mat3x4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), abs(a[2]-b[2])); return all(lessThanEqual(diff, vec4(eps))); }\n"
               ,0xa0);
  }
  if (uStack_60._3_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (mat4x2 a, mat4x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec2(eps))); }\n"
               ,0xb5);
  }
  if (uStack_60._4_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (mat4x3 a, mat4x3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec3(eps))); }\n"
               ,0xb5);
  }
  if (uStack_60._5_1_ == '\x01') {
    std::__ostream_insert<char,std::char_traits<char>>
              (&stream->super_basic_ostream<char,_std::char_traits<char>_>,
               "bool isOk (mat4 a, mat4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec4(eps))); }\n"
               ,0xb1);
    return;
  }
  return;
}

Assistant:

static void genCompareFunctions(ostringstream& stream, const ShaderCase::ValueBlock& valueBlock, bool useFloatTypes)
{
	bool cmpTypeFound[TYPE_LAST];
	for (int i			= 0; i < TYPE_LAST; i++)
		cmpTypeFound[i] = false;

	for (int valueNdx = 0; valueNdx < (int)valueBlock.values.size(); valueNdx++)
	{
		const ShaderCase::Value& val = valueBlock.values[valueNdx];
		if (val.storageType == ShaderCase::Value::STORAGE_OUTPUT)
			cmpTypeFound[(int)val.dataType] = true;
	}

	if (useFloatTypes)
	{
		if (cmpTypeFound[TYPE_BOOL])
			stream << "bool isOk (float a, bool b) { return ((a > 0.5) == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC2])
			stream << "bool isOk (vec2 a, bvec2 b) { return (greaterThan(a, vec2(0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC3])
			stream << "bool isOk (vec3 a, bvec3 b) { return (greaterThan(a, vec3(0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC4])
			stream << "bool isOk (vec4 a, bvec4 b) { return (greaterThan(a, vec4(0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_INT])
			stream << "bool isOk (float a, int b)  { float atemp = a+0.5; return (float(b) <= atemp && atemp <= "
					  "float(b+1)); }\n";
		if (cmpTypeFound[TYPE_INT_VEC2])
			stream << "bool isOk (vec2 a, ivec2 b) { return (ivec2(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC3])
			stream << "bool isOk (vec3 a, ivec3 b) { return (ivec3(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC4])
			stream << "bool isOk (vec4 a, ivec4 b) { return (ivec4(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_UINT])
			stream << "bool isOk (float a, uint b) { float atemp = a+0.5; return (float(b) <= atemp && atemp <= "
					  "float(b+1)); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC2])
			stream << "bool isOk (vec2 a, uvec2 b) { return (uvec2(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC3])
			stream << "bool isOk (vec3 a, uvec3 b) { return (uvec3(floor(a + 0.5)) == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC4])
			stream << "bool isOk (vec4 a, uvec4 b) { return (uvec4(floor(a + 0.5)) == b); }\n";
	}
	else
	{
		if (cmpTypeFound[TYPE_BOOL])
			stream << "bool isOk (bool a, bool b)   { return (a == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC2])
			stream << "bool isOk (bvec2 a, bvec2 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC3])
			stream << "bool isOk (bvec3 a, bvec3 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_BOOL_VEC4])
			stream << "bool isOk (bvec4 a, bvec4 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT])
			stream << "bool isOk (int a, int b)     { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC2])
			stream << "bool isOk (ivec2 a, ivec2 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC3])
			stream << "bool isOk (ivec3 a, ivec3 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_INT_VEC4])
			stream << "bool isOk (ivec4 a, ivec4 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT])
			stream << "bool isOk (uint a, uint b)   { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC2])
			stream << "bool isOk (uvec2 a, uvec2 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC3])
			stream << "bool isOk (uvec3 a, uvec3 b) { return (a == b); }\n";
		if (cmpTypeFound[TYPE_UINT_VEC4])
			stream << "bool isOk (uvec4 a, uvec4 b) { return (a == b); }\n";
	}

	if (cmpTypeFound[TYPE_FLOAT])
		stream << "bool isOk (float a, float b, float eps) { return (abs(a-b) <= (eps*abs(b) + eps)); }\n";
	if (cmpTypeFound[TYPE_FLOAT_VEC2])
		stream
			<< "bool isOk (vec2 a, vec2 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_VEC3])
		stream
			<< "bool isOk (vec3 a, vec3 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_VEC4])
		stream
			<< "bool isOk (vec4 a, vec4 b, float eps) { return all(lessThanEqual(abs(a-b), (eps*abs(b) + eps))); }\n";

	if (cmpTypeFound[TYPE_FLOAT_MAT2])
		stream << "bool isOk (mat2 a, mat2 b, float eps) { vec2 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return "
				  "all(lessThanEqual(diff, vec2(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT2X3])
		stream << "bool isOk (mat2x3 a, mat2x3 b, float eps) { vec3 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return "
				  "all(lessThanEqual(diff, vec3(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT2X4])
		stream << "bool isOk (mat2x4 a, mat2x4 b, float eps) { vec4 diff = max(abs(a[0]-b[0]), abs(a[1]-b[1])); return "
				  "all(lessThanEqual(diff, vec4(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT3X2])
		stream << "bool isOk (mat3x2 a, mat3x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "abs(a[2]-b[2])); return all(lessThanEqual(diff, vec2(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT3])
		stream << "bool isOk (mat3 a, mat3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "abs(a[2]-b[2])); return all(lessThanEqual(diff, vec3(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT3X4])
		stream << "bool isOk (mat3x4 a, mat3x4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "abs(a[2]-b[2])); return all(lessThanEqual(diff, vec4(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT4X2])
		stream << "bool isOk (mat4x2 a, mat4x2 b, float eps) { vec2 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec2(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT4X3])
		stream << "bool isOk (mat4x3 a, mat4x3 b, float eps) { vec3 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec3(eps))); }\n";
	if (cmpTypeFound[TYPE_FLOAT_MAT4])
		stream << "bool isOk (mat4 a, mat4 b, float eps) { vec4 diff = max(max(abs(a[0]-b[0]), abs(a[1]-b[1])), "
				  "max(abs(a[2]-b[2]), abs(a[3]-b[3]))); return all(lessThanEqual(diff, vec4(eps))); }\n";
}